

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_dup64_ppc(void *d,uint32_t desc,uint64_t c)

{
  undefined8 local_30;
  intptr_t i;
  intptr_t oprsz;
  uint64_t c_local;
  uint32_t desc_local;
  void *d_local;
  
  i = simd_oprsz(desc);
  if (c == 0) {
    i = 0;
  }
  else {
    for (local_30 = 0; local_30 < i; local_30 = local_30 + 8) {
      *(uint64_t *)((long)d + local_30) = c;
    }
  }
  clear_high(d,i,desc);
  return;
}

Assistant:

void HELPER(gvec_dup64)(void *d, uint32_t desc, uint64_t c)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    if (c == 0) {
        oprsz = 0;
    } else {
        for (i = 0; i < oprsz; i += sizeof(uint64_t)) {
            *(uint64_t *)((char *)d + i) = c;
        }
    }
    clear_high(d, oprsz, desc);
}